

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

bool vkt::anon_unknown_0::verifyStencilAttachment
               (vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
                *reference,ConstPixelBufferAccess *result,PixelBufferAccess *errorImage)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  bool *pbVar5;
  undefined1 local_70 [7];
  bool value;
  Maybe<bool> maybeValue;
  PixelValue *referenceValue;
  deUint32 resultStencil;
  int iStack_48;
  bool pixelOk;
  int x;
  int y;
  bool ok;
  Vec4 green;
  Vec4 red;
  PixelBufferAccess *errorImage_local;
  ConstPixelBufferAccess *result_local;
  vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
  *reference_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&y,0.0,1.0,0.0,1.0);
  x._3_1_ = true;
  for (iStack_48 = 0; iVar3 = tcu::ConstPixelBufferAccess::getHeight(result), iStack_48 < iVar3;
      iStack_48 = iStack_48 + 1) {
    for (resultStencil = 0; iVar3 = tcu::ConstPixelBufferAccess::getWidth(result),
        (int)resultStencil < iVar3; resultStencil = resultStencil + 1) {
      bVar1 = true;
      iVar3 = tcu::ConstPixelBufferAccess::getPixStencil(result,resultStencil,iStack_48,0);
      iVar4 = tcu::ConstPixelBufferAccess::getWidth(result);
      maybeValue.field_1 =
           (anon_union_8_2_d0736028_for_Maybe<bool>_2)
           std::
           vector<vkt::(anonymous_namespace)::PixelValue,_std::allocator<vkt::(anonymous_namespace)::PixelValue>_>
           ::operator[](reference,(long)(int)(resultStencil + iStack_48 * iVar4));
      PixelValue::getValue((PixelValue *)local_70,maybeValue.field_1.m_align);
      bVar2 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_70);
      if (bVar2) {
        pbVar5 = tcu::Maybe<bool>::operator*((Maybe<bool> *)local_70);
        if ((((*pbVar5 & 1U) != 0) && (iVar3 != 0xff)) || (((*pbVar5 & 1U) == 0 && (iVar3 != 0)))) {
          bVar1 = false;
        }
      }
      if (bVar1) {
        tcu::PixelBufferAccess::setPixel(errorImage,(Vec4 *)&y,resultStencil,iStack_48,0);
      }
      else {
        tcu::PixelBufferAccess::setPixel
                  (errorImage,(Vec4 *)(green.m_data + 2),resultStencil,iStack_48,0);
        x._3_1_ = false;
      }
      tcu::Maybe<bool>::~Maybe((Maybe<bool> *)local_70);
    }
  }
  return x._3_1_;
}

Assistant:

bool verifyStencilAttachment (const vector<PixelValue>&		reference,
							  const ConstPixelBufferAccess&	result,
							  const PixelBufferAccess&		errorImage)
{
	const Vec4	red		(1.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	green	(0.0f, 1.0f, 0.0f, 1.0f);
	bool		ok		= true;

	DE_ASSERT(result.getWidth() * result.getHeight() == (int)reference.size());
	DE_ASSERT(result.getWidth() == errorImage.getWidth());
	DE_ASSERT(result.getHeight() == errorImage.getHeight());

	for (int y = 0; y < result.getHeight(); y++)
	for (int x = 0; x < result.getWidth(); x++)
	{
		bool pixelOk = true;

		const deUint32		resultStencil	= result.getPixStencil(x, y);
		const PixelValue&	referenceValue	= reference[x + y * result.getWidth()];
		const Maybe<bool>	maybeValue		= referenceValue.getValue(1);

		if (maybeValue)
		{
			const bool value = *maybeValue;

			if ((value && (resultStencil != 0xFFu))
				|| (!value && resultStencil != 0x0u))
				pixelOk = false;
		}

		if (!pixelOk)
		{
			errorImage.setPixel(red, x, y);
			ok = false;
		}
		else
			errorImage.setPixel(green, x, y);
	}

	return ok;
}